

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat02.c
# Opt level: O2

ssize_t th02_read(thdat_t *thdat,int entry_index,thtk_io_t *output,thtk_error_t **error)

{
  thdat_entry_t *ptVar1;
  size_t __size;
  void *buf;
  size_t size;
  ssize_t sVar2;
  thtk_io_t *input;
  long lVar3;
  
  ptVar1 = thdat->entries;
  __size = ptVar1[entry_index].zsize;
  buf = malloc(__size);
  size = thtk_io_pread(thdat->stream,buf,__size,ptVar1[entry_index].offset,error);
  if (size == ptVar1[entry_index].zsize) {
    for (lVar3 = 0; lVar3 < (long)size; lVar3 = lVar3 + 1) {
      *(byte *)((long)buf + lVar3) = *(byte *)((long)buf + lVar3) ^ (byte)ptVar1[entry_index].extra;
    }
    if (ptVar1[entry_index].size == size) {
      sVar2 = thtk_io_write(output,buf,size,error);
      free(buf);
      return sVar2;
    }
    input = thtk_io_open_memory(buf,size,error);
    if (input != (thtk_io_t *)0x0) {
      sVar2 = thtk_unrle(input,ptVar1[entry_index].zsize,output,error);
      thtk_io_close(input);
      return sVar2;
    }
  }
  else {
    free(buf);
  }
  return -1;
}

Assistant:

static ssize_t
th02_read(
    thdat_t* thdat,
    int entry_index,
    thtk_io_t* output,
    thtk_error_t** error)
{
    thdat_entry_t* entry = &thdat->entries[entry_index];
    unsigned char* data = malloc(entry->zsize);
    ssize_t ret;

#pragma omp critical
    {
        ret = thtk_io_pread(thdat->stream, data, entry->zsize, entry->offset, error);
    }
    if (ret != (ssize_t)entry->zsize) {
        free(data);
        return -1;
    }

    for (ssize_t i = 0; i < entry->zsize; ++i)
        data[i] ^= entry->extra;

    if (entry->size == entry->zsize) {
        ret = thtk_io_write(output, data, entry->zsize, error);
        free(data);
    } else {
        thtk_io_t* data_stream = thtk_io_open_memory(data, entry->zsize, error);
        if (!data_stream)
            return -1;
        ret = thtk_unrle(data_stream, entry->zsize, output, error);
        thtk_io_close(data_stream);
    }

    return ret;
}